

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * calculate_global_layer_weights(void)

{
  pointer pdVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  int iVar5;
  long lVar6;
  int n;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> weights;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  spatial_region::calculate_layer_weights
            (&weights,(spatial_region *)
                      psr._M_t.
                      super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                      .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
             balancing_particle_weight);
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar5 = mpi_rank;
  lVar6 = (long)mpi_rank;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (lVar6 == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,(long)nx_global,&local_61);
    std::vector<double,_std::allocator<double>_>::_M_move_assign();
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    iVar5 = n_sr;
    uVar2 = *nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < n_sr) {
      uVar2 = uVar2 + nx_ich / -2;
    }
    pdVar1 = (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar4 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar4; uVar4 = uVar4 + 1) {
      pdVar1[uVar4] =
           weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4];
    }
    for (uVar4 = 1; (long)uVar4 < (long)iVar5; uVar4 = uVar4 + 1) {
      iVar3 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4];
      if (uVar4 != iVar5 - 1) {
        iVar3 = iVar3 + nx_ich / -2;
      }
      MPI_Recv((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start +
               (long)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4] + (long)(nx_ich / 2),iVar3 - nx_ich / 2
               ,&ompi_mpi_double,uVar4 & 0xffffffff,uVar4 & 0xffffffff,&ompi_mpi_comm_world,0);
      iVar5 = n_sr;
    }
  }
  else {
    iVar3 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    if (iVar5 != n_sr + -1) {
      iVar3 = iVar3 + nx_ich / -2;
    }
    MPI_Send(weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + nx_ich / 2,iVar3 - nx_ich / 2,&ompi_mpi_double,0,
             lVar6,&ompi_mpi_comm_world);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return in_RDI;
}

Assistant:

vector<double> calculate_global_layer_weights() {
    auto weights = psr->calculate_layer_weights(balancing_particle_weight);

    vector<double> global_weights;

    if (mpi_rank == 0) {
        global_weights = vector<double>(nx_global);

        int left = 0;
        int right = ((n_sr > 0) ? nx_sr[0] - nx_ich / 2 : nx_sr[0]);

        for (int i = left; i < right; i++) {
            global_weights[i] = weights[i];
        }

        for (int n = 1; n < n_sr; n++) {
            left = nx_ich / 2;
            right = (n == n_sr-1 ? nx_sr[n] : nx_sr[n] - nx_ich / 2);
            MPI_Recv(&(global_weights[x0_sr[n] + left]), right-left, MPI_DOUBLE, n, n, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
        }
    } else {
        int left = nx_ich / 2;
        int right = (mpi_rank == n_sr-1 ? nx_sr[mpi_rank] : nx_sr[mpi_rank] - nx_ich / 2);
        MPI_Send(&(weights[left]), right - left, MPI_DOUBLE, 0, mpi_rank, MPI_COMM_WORLD);
    }

    return global_weights;
}